

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O1

int run_test_fs_event_no_callback_on_close(void)

{
  size_t sVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  uv_loop_t *puVar3;
  uv_loop_t *loop;
  int in_ECX;
  int extraout_EDX;
  long lVar4;
  char *pcVar5;
  uv_handle_t *puVar6;
  uv_fs_event_t *puVar7;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_7f8 [16];
  uv__queue uStack_7e8;
  uv__queue *puStack_7d8;
  uv_timer_t uStack_7d0;
  uv_fs_event_t uStack_758;
  uv_loop_t *puStack_6f0;
  uv_fs_event_t *puStack_6e8;
  long lStack_6e0;
  long lStack_6d8;
  uv_loop_t *puStack_6d0;
  long lStack_6c8;
  long lStack_6c0;
  uv_loop_t *puStack_6b8;
  size_t sStack_6a8;
  size_t sStack_6a0;
  size_t sStack_698;
  char acStack_690 [1032];
  uv_loop_t *puStack_288;
  undefined1 auStack_238 [16];
  uv_fs_event_t uStack_228;
  uv_fs_event_t uStack_1c0;
  uv_loop_t *puStack_158;
  code *pcStack_150;
  undefined8 uStack_140;
  code *pcStack_138;
  void *pvStack_130;
  undefined1 auStack_128 [16];
  uv_close_cb p_Stack_118;
  uv_close_cb p_Stack_110;
  uv_loop_t *puStack_108;
  uv_handle_t *puStack_100;
  uv_handle_t *puStack_f8;
  uv_handle_t *puStack_f0;
  undefined8 uStack_e0;
  long lStack_d8;
  uv_loop_t *puStack_d0;
  code *pcStack_c8;
  void *pvStack_b8;
  undefined1 auStack_b0 [128];
  uv_loop_t *puStack_30;
  long local_20;
  long local_18;
  
  puStack_30 = (uv_loop_t *)0x1854b3;
  puVar3 = uv_default_loop();
  puStack_30 = (uv_loop_t *)0x1854c5;
  remove("watch_dir/file1");
  puStack_30 = (uv_loop_t *)0x1854d1;
  remove("watch_dir/");
  puStack_30 = (uv_loop_t *)0x1854dd;
  create_dir("watch_dir");
  puStack_30 = (uv_loop_t *)0x1854e5;
  create_file("watch_dir/file1");
  puStack_30 = (uv_loop_t *)0x1854f4;
  iVar2 = uv_fs_event_init(puVar3,&fs_event);
  local_18 = (long)iVar2;
  local_20 = 0;
  if (local_18 == 0) {
    in_ECX = 0;
    puStack_30 = (uv_loop_t *)0x185530;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_file,"watch_dir/file1",0);
    local_18 = (long)iVar2;
    local_20 = 0;
    if (local_18 != 0) goto LAB_0018562c;
    puStack_30 = (uv_loop_t *)0x185563;
    uv_close((uv_handle_t *)&fs_event,close_cb);
    puStack_30 = (uv_loop_t *)0x18556d;
    uv_run(puVar3,UV_RUN_DEFAULT);
    local_18 = (long)fs_event_cb_called;
    local_20 = 0;
    if (local_18 != 0) goto LAB_0018563b;
    local_18 = 1;
    local_20 = (long)close_cb_called;
    if (local_20 != 1) goto LAB_0018564a;
    puStack_30 = (uv_loop_t *)0x1855c3;
    remove("watch_dir/file1");
    puStack_30 = (uv_loop_t *)0x1855cf;
    remove("watch_dir/");
    puStack_30 = (uv_loop_t *)0x1855e0;
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    puStack_30 = (uv_loop_t *)0x1855ea;
    uv_run(puVar3,UV_RUN_DEFAULT);
    local_18 = 0;
    puStack_30 = (uv_loop_t *)0x1855fb;
    iVar2 = uv_loop_close(puVar3);
    local_20 = (long)iVar2;
    if (local_18 == local_20) {
      puStack_30 = (uv_loop_t *)0x185613;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_30 = (uv_loop_t *)0x18562c;
    run_test_fs_event_no_callback_on_close_cold_1();
LAB_0018562c:
    puStack_30 = (uv_loop_t *)0x18563b;
    run_test_fs_event_no_callback_on_close_cold_2();
LAB_0018563b:
    puStack_30 = (uv_loop_t *)0x18564a;
    run_test_fs_event_no_callback_on_close_cold_3();
LAB_0018564a:
    puStack_30 = (uv_loop_t *)0x185659;
    run_test_fs_event_no_callback_on_close_cold_4();
  }
  puStack_30 = (uv_loop_t *)run_test_fs_event_immediate_close;
  run_test_fs_event_no_callback_on_close_cold_5();
  pcStack_c8 = (code *)0x185675;
  puStack_30 = puVar3;
  puVar3 = uv_default_loop();
  pcStack_c8 = (code *)0x185685;
  iVar2 = uv_timer_init(puVar3,(uv_timer_t *)(auStack_b0 + 8));
  auStack_b0._0_8_ = SEXT48(iVar2);
  pvStack_b8 = (void *)0x0;
  if ((void *)auStack_b0._0_8_ == (void *)0x0) {
    in_ECX = 0;
    pcStack_c8 = (code *)0x1856bd;
    iVar2 = uv_timer_start((uv_timer_t *)(auStack_b0 + 8),timer_cb,1,0);
    auStack_b0._0_8_ = SEXT48(iVar2);
    pvStack_b8 = (void *)0x0;
    if ((void *)auStack_b0._0_8_ != (void *)0x0) goto LAB_00185766;
    pcStack_c8 = (code *)0x1856e7;
    uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_b0._0_8_ = (void *)0x2;
    pvStack_b8 = (void *)(long)close_cb_called;
    if (pvStack_b8 != (void *)0x2) goto LAB_00185775;
    pcStack_c8 = (code *)0x185719;
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    pcStack_c8 = (code *)0x185723;
    uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_b0._0_8_ = (void *)0x0;
    pcStack_c8 = (code *)0x185734;
    iVar2 = uv_loop_close(puVar3);
    pvStack_b8 = (void *)(long)iVar2;
    if ((void *)auStack_b0._0_8_ == pvStack_b8) {
      pcStack_c8 = (code *)0x18574c;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_c8 = (code *)0x185766;
    run_test_fs_event_immediate_close_cold_1();
LAB_00185766:
    pcStack_c8 = (code *)0x185775;
    run_test_fs_event_immediate_close_cold_2();
LAB_00185775:
    pcStack_c8 = (code *)0x185784;
    run_test_fs_event_immediate_close_cold_3();
  }
  puVar6 = (uv_handle_t *)auStack_b0;
  pcStack_c8 = timer_cb;
  run_test_fs_event_immediate_close_cold_4();
  pcStack_c8 = (code *)0x1f9b0e;
  puStack_f0 = (uv_handle_t *)0x1857ad;
  puStack_d0 = puVar3;
  iVar2 = uv_fs_event_init(puVar6->loop,&fs_event);
  lStack_d8 = (long)iVar2;
  uStack_e0 = 0;
  if (lStack_d8 == 0) {
    in_ECX = 0;
    puStack_f0 = (uv_handle_t *)0x1857e5;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_fail,".",0);
    lStack_d8 = (long)iVar2;
    uStack_e0 = 0;
    if (lStack_d8 == 0) {
      puStack_f0 = (uv_handle_t *)0x185817;
      uv_close((uv_handle_t *)&fs_event,close_cb);
      uv_close(puVar6,close_cb);
      return extraout_EAX;
    }
  }
  else {
    puStack_f0 = (uv_handle_t *)0x185838;
    timer_cb_cold_1();
  }
  puStack_f0 = (uv_handle_t *)run_test_fs_event_close_with_pending_event;
  timer_cb_cold_2();
  puStack_108 = (uv_loop_t *)0x185851;
  puStack_f0 = puVar6;
  puVar3 = uv_default_loop();
  puStack_108 = (uv_loop_t *)0x185860;
  create_dir("watch_dir");
  puStack_108 = (uv_loop_t *)0x18586c;
  create_file("watch_dir/file");
  puStack_108 = (uv_loop_t *)0x18587b;
  iVar2 = uv_fs_event_init(puVar3,&fs_event);
  puStack_f8 = (uv_handle_t *)(long)iVar2;
  puStack_100 = (uv_handle_t *)0x0;
  if (puStack_f8 == (uv_handle_t *)0x0) {
    in_ECX = 0;
    puStack_108 = (uv_loop_t *)0x1858b5;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_fail,"watch_dir",0);
    puStack_f8 = (uv_handle_t *)(long)iVar2;
    puStack_100 = (uv_handle_t *)0x0;
    if (puStack_f8 != (uv_handle_t *)0x0) goto LAB_0018598a;
    puStack_108 = (uv_loop_t *)0x1858df;
    touch_file("watch_dir/file");
    puStack_108 = (uv_loop_t *)0x1858f2;
    uv_close((uv_handle_t *)&fs_event,close_cb);
    puStack_108 = (uv_loop_t *)0x1858fc;
    uv_run(puVar3,UV_RUN_DEFAULT);
    puStack_f8 = (uv_handle_t *)0x1;
    puStack_100 = (uv_handle_t *)(long)close_cb_called;
    if (puStack_100 != (uv_handle_t *)0x1) goto LAB_00185997;
    puStack_108 = (uv_loop_t *)0x185927;
    remove("watch_dir/file");
    puStack_108 = (uv_loop_t *)0x185933;
    remove("watch_dir/");
    puStack_108 = (uv_loop_t *)0x185944;
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    puStack_108 = (uv_loop_t *)0x18594e;
    uv_run(puVar3,UV_RUN_DEFAULT);
    puStack_f8 = (uv_handle_t *)0x0;
    puStack_108 = (uv_loop_t *)0x18595f;
    iVar2 = uv_loop_close(puVar3);
    puStack_100 = (uv_handle_t *)(long)iVar2;
    if (puStack_f8 == puStack_100) {
      puStack_108 = (uv_loop_t *)0x185975;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_108 = (uv_loop_t *)0x18598a;
    run_test_fs_event_close_with_pending_event_cold_1();
LAB_0018598a:
    puStack_108 = (uv_loop_t *)0x185997;
    run_test_fs_event_close_with_pending_event_cold_2();
LAB_00185997:
    puStack_108 = (uv_loop_t *)0x1859a4;
    run_test_fs_event_close_with_pending_event_cold_3();
  }
  puStack_108 = (uv_loop_t *)run_test_fs_event_close_with_pending_delete_event;
  run_test_fs_event_close_with_pending_event_cold_4();
  auStack_128._8_8_ = (uv_loop_t *)0x1859bb;
  puStack_108 = puVar3;
  puVar3 = uv_default_loop();
  auStack_128._8_8_ = (uv_loop_t *)0x1859ca;
  create_dir("watch_dir");
  auStack_128._8_8_ = (uv_loop_t *)0x1859d6;
  create_file("watch_dir/file");
  auStack_128._8_8_ = (uv_loop_t *)0x1859e5;
  iVar2 = uv_fs_event_init(puVar3,&fs_event);
  p_Stack_110 = (uv_close_cb)(long)iVar2;
  p_Stack_118 = (uv_close_cb)0x0;
  if (p_Stack_110 == (uv_close_cb)0x0) {
    in_ECX = 0;
    auStack_128._8_8_ = (uv_loop_t *)0x185a1f;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_fail,"watch_dir/file",0);
    p_Stack_110 = (uv_close_cb)(long)iVar2;
    p_Stack_118 = (uv_close_cb)0x0;
    if (p_Stack_110 != (uv_close_cb)0x0) goto LAB_00185afa;
    auStack_128._8_8_ = (uv_loop_t *)0x185a49;
    remove("watch_dir/file");
    auStack_128._8_8_ = (uv_loop_t *)0x185a53;
    uv_sleep(0x44c);
    auStack_128._8_8_ = (uv_loop_t *)0x185a5b;
    uv_update_time(puVar3);
    auStack_128._8_8_ = (uv_loop_t *)0x185a6e;
    uv_close((uv_handle_t *)&fs_event,close_cb);
    auStack_128._8_8_ = (uv_loop_t *)0x185a78;
    uv_run(puVar3,UV_RUN_DEFAULT);
    p_Stack_110 = (uv_close_cb)0x1;
    p_Stack_118 = (uv_close_cb)(long)close_cb_called;
    if (p_Stack_118 != (uv_close_cb)0x1) goto LAB_00185b07;
    auStack_128._8_8_ = (uv_loop_t *)0x185aa3;
    remove("watch_dir/");
    auStack_128._8_8_ = (uv_loop_t *)0x185ab4;
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    auStack_128._8_8_ = (uv_loop_t *)0x185abe;
    uv_run(puVar3,UV_RUN_DEFAULT);
    p_Stack_110 = (uv_close_cb)0x0;
    auStack_128._8_8_ = (uv_loop_t *)0x185acf;
    iVar2 = uv_loop_close(puVar3);
    p_Stack_118 = (uv_close_cb)(long)iVar2;
    if (p_Stack_110 == p_Stack_118) {
      auStack_128._8_8_ = (uv_loop_t *)0x185ae5;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_128._8_8_ = (uv_loop_t *)0x185afa;
    run_test_fs_event_close_with_pending_delete_event_cold_1();
LAB_00185afa:
    auStack_128._8_8_ = (uv_loop_t *)0x185b07;
    run_test_fs_event_close_with_pending_delete_event_cold_2();
LAB_00185b07:
    auStack_128._8_8_ = (uv_loop_t *)0x185b14;
    run_test_fs_event_close_with_pending_delete_event_cold_3();
  }
  auStack_128._8_8_ = run_test_fs_event_close_in_callback;
  run_test_fs_event_close_with_pending_delete_event_cold_4();
  pcStack_138 = (code *)0x185b2b;
  auStack_128._8_8_ = puVar3;
  puVar3 = uv_default_loop();
  pcStack_138 = (code *)0x185b35;
  fs_event_unlink_files((uv_timer_t *)0x0);
  pcStack_138 = (code *)0x185b41;
  create_dir("watch_dir");
  pcStack_138 = (code *)0x185b50;
  iVar2 = uv_fs_event_init(puVar3,&fs_event);
  auStack_128._0_8_ = SEXT48(iVar2);
  pvStack_130 = (void *)0x0;
  if ((void *)auStack_128._0_8_ == (void *)0x0) {
    in_ECX = 0;
    pcStack_138 = (code *)0x185b8a;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_close,"watch_dir",0);
    auStack_128._0_8_ = SEXT48(iVar2);
    pvStack_130 = (void *)0x0;
    if ((void *)auStack_128._0_8_ != (void *)0x0) goto LAB_00185ce7;
    pcStack_138 = (code *)0x185bb7;
    iVar2 = uv_timer_init(puVar3,&timer);
    auStack_128._0_8_ = SEXT48(iVar2);
    pvStack_130 = (void *)0x0;
    if ((void *)auStack_128._0_8_ != (void *)0x0) goto LAB_00185cf4;
    in_ECX = 0;
    pcStack_138 = (code *)0x185bef;
    iVar2 = uv_timer_start(&timer,fs_event_create_files,100,0);
    auStack_128._0_8_ = SEXT48(iVar2);
    pvStack_130 = (void *)0x0;
    if ((void *)auStack_128._0_8_ != (void *)0x0) goto LAB_00185d01;
    pcStack_138 = (code *)0x185c17;
    uv_run(puVar3,UV_RUN_DEFAULT);
    pcStack_138 = (code *)0x185c2a;
    uv_close((uv_handle_t *)&timer,close_cb);
    pcStack_138 = (code *)0x185c37;
    uv_run(puVar3,UV_RUN_ONCE);
    auStack_128._0_8_ = (void *)0x2;
    pvStack_130 = (void *)(long)close_cb_called;
    if (pvStack_130 != (void *)0x2) goto LAB_00185d0e;
    auStack_128._0_8_ = (void *)0x3;
    pvStack_130 = (void *)(long)fs_event_cb_called;
    if (pvStack_130 != (void *)0x3) goto LAB_00185d1b;
    pcStack_138 = (code *)0x185c84;
    fs_event_unlink_files((uv_timer_t *)0x0);
    pcStack_138 = (code *)0x185c90;
    remove("watch_dir/");
    pcStack_138 = (code *)0x185ca1;
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    pcStack_138 = (code *)0x185cab;
    uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_128._0_8_ = (void *)0x0;
    pcStack_138 = (code *)0x185cbc;
    iVar2 = uv_loop_close(puVar3);
    pvStack_130 = (void *)(long)iVar2;
    if ((void *)auStack_128._0_8_ == pvStack_130) {
      pcStack_138 = (code *)0x185cd2;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_138 = (code *)0x185ce7;
    run_test_fs_event_close_in_callback_cold_1();
LAB_00185ce7:
    pcStack_138 = (code *)0x185cf4;
    run_test_fs_event_close_in_callback_cold_2();
LAB_00185cf4:
    pcStack_138 = (code *)0x185d01;
    run_test_fs_event_close_in_callback_cold_3();
LAB_00185d01:
    pcStack_138 = (code *)0x185d0e;
    run_test_fs_event_close_in_callback_cold_4();
LAB_00185d0e:
    pcStack_138 = (code *)0x185d1b;
    run_test_fs_event_close_in_callback_cold_5();
LAB_00185d1b:
    pcStack_138 = (code *)0x185d28;
    run_test_fs_event_close_in_callback_cold_6();
  }
  puVar6 = (uv_handle_t *)auStack_128;
  pcStack_138 = fs_event_cb_close;
  run_test_fs_event_close_in_callback_cold_7();
  pcStack_138 = (code *)(long)in_ECX;
  uStack_140 = 0;
  if (pcStack_138 == (code *)0x0) {
    pcStack_138 = (code *)(long)fs_event_cb_called;
    uStack_140 = 3;
    in_ECX = fs_event_cb_called;
    if ((long)pcStack_138 < 3) {
      fs_event_cb_called = fs_event_cb_called + 1;
      if (fs_event_cb_called == 3) {
        uv_close(puVar6,close_cb);
        return extraout_EAX_00;
      }
      return fs_event_cb_called;
    }
  }
  else {
    pcStack_150 = (code *)0x185da8;
    fs_event_cb_close_cold_1();
  }
  pcStack_150 = run_test_fs_event_start_and_close;
  fs_event_cb_close_cold_2();
  pcStack_150 = (code *)0x1f9b0e;
  puStack_158 = puVar3;
  puVar3 = uv_default_loop();
  create_dir("watch_dir");
  iVar2 = uv_fs_event_init(puVar3,&uStack_1c0);
  uStack_228.data = (void *)(long)iVar2;
  auStack_238._0_8_ = (uv_loop_t *)0x0;
  if (uStack_228.data == (void *)0x0) {
    in_ECX = 0;
    iVar2 = uv_fs_event_start(&uStack_1c0,fs_event_cb_dir,"watch_dir",0);
    uStack_228.data = (void *)(long)iVar2;
    auStack_238._0_8_ = (uv_loop_t *)0x0;
    if (uStack_228.data != (void *)0x0) goto LAB_00185f68;
    iVar2 = uv_fs_event_init(puVar3,&uStack_228);
    auStack_238._0_8_ = SEXT48(iVar2);
    auStack_238._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_238._0_8_ != (uv_loop_t *)0x0) goto LAB_00185f77;
    in_ECX = 0;
    iVar2 = uv_fs_event_start(&uStack_228,fs_event_cb_dir,"watch_dir",0);
    auStack_238._0_8_ = SEXT48(iVar2);
    auStack_238._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_238._0_8_ != (uv_loop_t *)0x0) goto LAB_00185f86;
    uv_close((uv_handle_t *)&uStack_228,close_cb);
    uv_close((uv_handle_t *)&uStack_1c0,close_cb);
    uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_238._0_8_ = (uv_loop_t *)0x2;
    auStack_238._8_8_ = SEXT48(close_cb_called);
    if ((uv_loop_t *)auStack_238._8_8_ != (uv_loop_t *)0x2) goto LAB_00185f95;
    remove("watch_dir/");
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_238._0_8_ = (uv_loop_t *)0x0;
    iVar2 = uv_loop_close(puVar3);
    auStack_238._8_8_ = SEXT48(iVar2);
    if (auStack_238._0_8_ == auStack_238._8_8_) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_fs_event_start_and_close_cold_1();
LAB_00185f68:
    run_test_fs_event_start_and_close_cold_2();
LAB_00185f77:
    run_test_fs_event_start_and_close_cold_3();
LAB_00185f86:
    run_test_fs_event_start_and_close_cold_4();
LAB_00185f95:
    run_test_fs_event_start_and_close_cold_5();
  }
  puVar7 = (uv_fs_event_t *)auStack_238;
  pcVar5 = auStack_238 + 8;
  run_test_fs_event_start_and_close_cold_6();
  fs_event_cb_called = fs_event_cb_called + 1;
  if (puVar7 == &fs_event) {
    if (in_ECX != 0) goto LAB_00186081;
    if (extraout_EDX != 2) goto LAB_00186090;
    iVar2 = strcmp(pcVar5,"file1");
    if (iVar2 != 0) goto LAB_0018609f;
    iVar2 = uv_fs_event_stop(&fs_event);
    if (iVar2 == 0) {
      uv_close((uv_handle_t *)&fs_event,close_cb);
      return extraout_EAX_01;
    }
  }
  else {
    fs_event_cb_dir_cold_1();
LAB_00186081:
    fs_event_cb_dir_cold_2();
LAB_00186090:
    fs_event_cb_dir_cold_3();
LAB_0018609f:
    fs_event_cb_dir_cold_4();
  }
  fs_event_cb_dir_cold_5();
  puStack_6b8 = (uv_loop_t *)0x1860d3;
  puStack_288 = puVar3;
  puVar3 = uv_default_loop();
  puStack_6b8 = (uv_loop_t *)0x1860e2;
  create_dir("watch_dir");
  puStack_6b8 = (uv_loop_t *)0x1860ee;
  create_dir("watch_dir/subfolder");
  lVar4 = 0;
  sVar1 = sStack_6a8;
  do {
    sStack_6a8 = sVar1;
    puStack_6b8 = (uv_loop_t *)0x18610c;
    iVar2 = uv_fs_event_init(puVar3,&fs_event);
    sStack_6a0 = (size_t)iVar2;
    sStack_6a8 = 0;
    if (sStack_6a0 != 0) {
LAB_001863fc:
      puStack_6b8 = (uv_loop_t *)0x18640b;
      run_test_fs_event_getpath_cold_1();
      goto LAB_0018640b;
    }
    sStack_698 = 0x400;
    puStack_6b8 = (uv_loop_t *)0x186143;
    iVar2 = uv_fs_event_getpath(&fs_event,acStack_690,&sStack_698);
    sStack_6a0 = (size_t)iVar2;
    sStack_6a8 = 0xffffffffffffffea;
    if (sStack_6a0 != 0xffffffffffffffea) {
LAB_001863ed:
      puStack_6b8 = (uv_loop_t *)0x1863fc;
      run_test_fs_event_getpath_cold_2();
      goto LAB_001863fc;
    }
    pcVar5 = *(char **)((long)&DAT_00268bc0 + lVar4);
    puStack_6b8 = (uv_loop_t *)0x186183;
    iVar2 = uv_fs_event_start(&fs_event,fail_cb,pcVar5,0);
    sStack_6a0 = (size_t)iVar2;
    sStack_6a8 = 0;
    if (sStack_6a0 != 0) {
LAB_001863de:
      puStack_6b8 = (uv_loop_t *)0x1863ed;
      run_test_fs_event_getpath_cold_3();
      goto LAB_001863ed;
    }
    sStack_698 = 0;
    puStack_6b8 = (uv_loop_t *)0x1861ba;
    iVar2 = uv_fs_event_getpath(&fs_event,acStack_690,&sStack_698);
    sStack_6a0 = (size_t)iVar2;
    sStack_6a8 = 0xffffffffffffff97;
    if (sStack_6a0 != 0xffffffffffffff97) {
LAB_001863cf:
      puStack_6b8 = (uv_loop_t *)0x1863de;
      run_test_fs_event_getpath_cold_4();
      goto LAB_001863de;
    }
    sStack_6a0 = sStack_698;
    sStack_6a8 = 0x400;
    if (0x3ff < (long)sStack_698) {
LAB_001863c0:
      puStack_6b8 = (uv_loop_t *)0x1863cf;
      run_test_fs_event_getpath_cold_5();
      goto LAB_001863cf;
    }
    puStack_6b8 = (uv_loop_t *)0x18620a;
    sStack_6a8 = strlen(pcVar5);
    sStack_6a8 = sStack_6a8 + 1;
    if (sStack_6a0 != sStack_6a8) {
LAB_001863b1:
      puStack_6b8 = (uv_loop_t *)0x1863c0;
      run_test_fs_event_getpath_cold_6();
      goto LAB_001863c0;
    }
    puStack_6b8 = (uv_loop_t *)0x186230;
    iVar2 = uv_fs_event_getpath(&fs_event,acStack_690,&sStack_698);
    sStack_6a0 = (size_t)iVar2;
    sStack_6a8 = 0;
    if (sStack_6a0 != 0) {
LAB_001863a2:
      puStack_6b8 = (uv_loop_t *)0x1863b1;
      run_test_fs_event_getpath_cold_7();
      goto LAB_001863b1;
    }
    sStack_6a0 = sStack_698;
    puStack_6b8 = (uv_loop_t *)0x186262;
    sStack_6a8 = strlen(pcVar5);
    if (sStack_6a0 != sStack_6a8) {
LAB_00186393:
      puStack_6b8 = (uv_loop_t *)0x1863a2;
      run_test_fs_event_getpath_cold_8();
      goto LAB_001863a2;
    }
    puStack_6b8 = (uv_loop_t *)0x186282;
    iVar2 = strcmp(acStack_690,pcVar5);
    if (iVar2 != 0) {
LAB_0018638e:
      puStack_6b8 = (uv_loop_t *)0x186393;
      run_test_fs_event_getpath_cold_9();
      goto LAB_00186393;
    }
    puStack_6b8 = (uv_loop_t *)0x186292;
    iVar2 = uv_fs_event_stop(&fs_event);
    sStack_6a0 = (size_t)iVar2;
    sStack_6a8 = 0;
    if (sStack_6a0 != 0) {
LAB_0018637f:
      puStack_6b8 = (uv_loop_t *)0x18638e;
      run_test_fs_event_getpath_cold_10();
      goto LAB_0018638e;
    }
    puStack_6b8 = (uv_loop_t *)0x1862c1;
    uv_close((uv_handle_t *)&fs_event,close_cb);
    puStack_6b8 = (uv_loop_t *)0x1862cb;
    uv_run(puVar3,UV_RUN_DEFAULT);
    sStack_6a0 = 1;
    sStack_6a8 = (size_t)close_cb_called;
    if (sStack_6a8 != 1) {
      puStack_6b8 = (uv_loop_t *)0x18637f;
      run_test_fs_event_getpath_cold_11();
      goto LAB_0018637f;
    }
    close_cb_called = 0;
    lVar4 = lVar4 + 8;
    sVar1 = 1;
  } while (lVar4 != 0x28);
  puStack_6b8 = (uv_loop_t *)0x186314;
  remove("watch_dir/");
  puStack_6b8 = (uv_loop_t *)0x186325;
  uv_walk(puVar3,close_walk_cb,(void *)0x0);
  puStack_6b8 = (uv_loop_t *)0x18632f;
  uv_run(puVar3,UV_RUN_DEFAULT);
  sStack_6a0 = 0;
  puStack_6b8 = (uv_loop_t *)0x186340;
  iVar2 = uv_loop_close(puVar3);
  sStack_6a8 = (size_t)iVar2;
  if (sStack_6a0 == sStack_6a8) {
    puStack_6b8 = (uv_loop_t *)0x18635c;
    uv_library_shutdown();
    return 0;
  }
LAB_0018640b:
  puStack_6b8 = (uv_loop_t *)run_test_fs_event_error_reporting;
  run_test_fs_event_getpath_cold_12();
  puStack_6d0 = (uv_loop_t *)0x186424;
  puStack_6b8 = puVar3;
  puVar3 = uv_default_loop();
  puStack_6d0 = (uv_loop_t *)0x186438;
  uv_walk(puVar3,close_walk_cb,(void *)0x0);
  puStack_6d0 = (uv_loop_t *)0x186442;
  uv_run(puVar3,UV_RUN_DEFAULT);
  lStack_6c0 = 0;
  puStack_6d0 = (uv_loop_t *)0x186450;
  loop = uv_default_loop();
  puStack_6d0 = (uv_loop_t *)0x186458;
  iVar2 = uv_loop_close(loop);
  lStack_6c8 = (long)iVar2;
  if (lStack_6c0 == lStack_6c8) {
    puStack_6d0 = (uv_loop_t *)0x18646e;
    uv_library_shutdown();
    return 0;
  }
  puStack_6d0 = (uv_loop_t *)run_test_fs_event_watch_invalid_path;
  run_test_fs_event_error_reporting_cold_1();
  puStack_6e8 = (uv_fs_event_t *)0x18648d;
  puStack_6d0 = puVar3;
  puVar3 = uv_default_loop();
  puStack_6e8 = (uv_fs_event_t *)0x18649f;
  iVar2 = uv_fs_event_init(puVar3,&fs_event);
  lStack_6d8 = (long)iVar2;
  lStack_6e0 = 0;
  if (lStack_6d8 == 0) {
    puStack_6e8 = (uv_fs_event_t *)0x1864d9;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_file,"<:;",0);
    if (iVar2 == 0) goto LAB_001865ac;
    puStack_6e8 = (uv_fs_event_t *)0x1864ed;
    iVar2 = uv_is_active((uv_handle_t *)&fs_event);
    lStack_6d8 = (long)iVar2;
    lStack_6e0 = 0;
    if (lStack_6d8 != 0) goto LAB_001865b1;
    puStack_6e8 = (uv_fs_event_t *)0x186527;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_file,"",0);
    if (iVar2 == 0) goto LAB_001865be;
    puStack_6e8 = (uv_fs_event_t *)0x18653b;
    iVar2 = uv_is_active((uv_handle_t *)&fs_event);
    lStack_6d8 = (long)iVar2;
    lStack_6e0 = 0;
    if (lStack_6d8 != 0) goto LAB_001865c3;
    puStack_6e8 = (uv_fs_event_t *)0x186566;
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    puStack_6e8 = (uv_fs_event_t *)0x186570;
    uv_run(puVar3,UV_RUN_DEFAULT);
    lStack_6d8 = 0;
    puStack_6e8 = (uv_fs_event_t *)0x186581;
    iVar2 = uv_loop_close(puVar3);
    lStack_6e0 = (long)iVar2;
    if (lStack_6d8 == lStack_6e0) {
      puStack_6e8 = (uv_fs_event_t *)0x186597;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_6e8 = (uv_fs_event_t *)0x1865ac;
    run_test_fs_event_watch_invalid_path_cold_1();
LAB_001865ac:
    puStack_6e8 = (uv_fs_event_t *)0x1865b1;
    run_test_fs_event_watch_invalid_path_cold_6();
LAB_001865b1:
    puStack_6e8 = (uv_fs_event_t *)0x1865be;
    run_test_fs_event_watch_invalid_path_cold_2();
LAB_001865be:
    puStack_6e8 = (uv_fs_event_t *)0x1865c3;
    run_test_fs_event_watch_invalid_path_cold_5();
LAB_001865c3:
    puStack_6e8 = (uv_fs_event_t *)0x1865d0;
    run_test_fs_event_watch_invalid_path_cold_3();
  }
  puStack_6e8 = (uv_fs_event_t *)run_test_fs_event_stop_in_cb;
  run_test_fs_event_watch_invalid_path_cold_4();
  puStack_6e8 = &fs_event;
  puVar7 = (uv_fs_event_t *)auStack_7f8;
  uStack_7e8.next = (uv__queue *)0x746e6576655f7366;
  uStack_7e8.prev = (uv__queue *)0x6e695f706f74735f;
  puStack_7d8 = (uv__queue *)0x7478742e62635f;
  puStack_6f0 = puVar3;
  remove((char *)&uStack_7e8);
  create_file((char *)&uStack_7e8);
  puVar3 = uv_default_loop();
  iVar2 = uv_fs_event_init(puVar3,&uStack_758);
  uStack_7d0.data = (void *)(long)iVar2;
  auStack_7f8._0_8_ = (uv_loop_t *)0x0;
  if ((uv__queue *)uStack_7d0.data == (uv__queue *)0x0) {
    iVar2 = uv_fs_event_start(&uStack_758,fs_event_cb_stop,(char *)&uStack_7e8,0);
    uStack_7d0.data = (void *)(long)iVar2;
    auStack_7f8._0_8_ = (uv_loop_t *)0x0;
    if ((uv__queue *)uStack_7d0.data != (uv__queue *)0x0) goto LAB_0018687e;
    uStack_7d0.data = &uStack_7e8;
    puVar3 = uv_default_loop();
    iVar2 = uv_timer_init(puVar3,&uStack_7d0);
    auStack_7f8._0_8_ = SEXT48(iVar2);
    auStack_7f8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_7f8._0_8_ != (uv_loop_t *)0x0) goto LAB_0018688b;
    iVar2 = uv_timer_start(&uStack_7d0,timer_cb_touch,100,0);
    auStack_7f8._0_8_ = SEXT48(iVar2);
    auStack_7f8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_7f8._0_8_ != (uv_loop_t *)0x0) goto LAB_00186898;
    auStack_7f8._0_8_ = SEXT48(fs_event_cb_stop_calls);
    auStack_7f8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_7f8._0_8_ != (uv_loop_t *)0x0) goto LAB_001868a5;
    auStack_7f8._0_8_ = SEXT48(timer_cb_touch_called);
    auStack_7f8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_7f8._0_8_ != (uv_loop_t *)0x0) goto LAB_001868b2;
    puVar3 = uv_default_loop();
    iVar2 = uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_7f8._0_8_ = SEXT48(iVar2);
    auStack_7f8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_7f8._0_8_ != (uv_loop_t *)0x0) goto LAB_001868bf;
    auStack_7f8._0_8_ = (uv_loop_t *)0x1;
    auStack_7f8._8_8_ = SEXT48(fs_event_cb_stop_calls);
    if ((uv_loop_t *)auStack_7f8._8_8_ != (uv_loop_t *)0x1) goto LAB_001868cc;
    auStack_7f8._0_8_ = (uv_loop_t *)0x1;
    auStack_7f8._8_8_ = SEXT48(timer_cb_touch_called);
    if ((uv_loop_t *)auStack_7f8._8_8_ != (uv_loop_t *)0x1) goto LAB_001868d9;
    uv_close((uv_handle_t *)&uStack_758,(uv_close_cb)0x0);
    puVar3 = uv_default_loop();
    iVar2 = uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_7f8._0_8_ = SEXT48(iVar2);
    auStack_7f8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_7f8._0_8_ != (uv_loop_t *)0x0) goto LAB_001868e6;
    auStack_7f8._0_8_ = (uv_loop_t *)0x1;
    auStack_7f8._8_8_ = SEXT48(fs_event_cb_stop_calls);
    if ((uv_loop_t *)auStack_7f8._8_8_ == (uv_loop_t *)0x1) {
      remove((char *)&uStack_7e8);
      puVar3 = uv_default_loop();
      uv_walk(puVar3,close_walk_cb,(void *)0x0);
      uv_run(puVar3,UV_RUN_DEFAULT);
      auStack_7f8._0_8_ = (uv_loop_t *)0x0;
      puVar3 = uv_default_loop();
      iVar2 = uv_loop_close(puVar3);
      auStack_7f8._8_8_ = SEXT48(iVar2);
      if (auStack_7f8._0_8_ == auStack_7f8._8_8_) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_00186900;
    }
  }
  else {
    run_test_fs_event_stop_in_cb_cold_1();
LAB_0018687e:
    run_test_fs_event_stop_in_cb_cold_2();
LAB_0018688b:
    run_test_fs_event_stop_in_cb_cold_3();
LAB_00186898:
    run_test_fs_event_stop_in_cb_cold_4();
LAB_001868a5:
    run_test_fs_event_stop_in_cb_cold_5();
LAB_001868b2:
    run_test_fs_event_stop_in_cb_cold_6();
LAB_001868bf:
    run_test_fs_event_stop_in_cb_cold_7();
LAB_001868cc:
    run_test_fs_event_stop_in_cb_cold_8();
LAB_001868d9:
    run_test_fs_event_stop_in_cb_cold_9();
LAB_001868e6:
    run_test_fs_event_stop_in_cb_cold_10();
  }
  run_test_fs_event_stop_in_cb_cold_11();
LAB_00186900:
  run_test_fs_event_stop_in_cb_cold_12();
  uv_fs_event_stop(puVar7);
  fs_event_cb_stop_calls = fs_event_cb_stop_calls + 1;
  return extraout_EAX_02;
}

Assistant:

TEST_IMPL(fs_event_no_callback_on_close) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif

  uv_loop_t* loop = uv_default_loop();
  int r;

  /* Setup */
  remove("watch_dir/file1");
  remove("watch_dir/");
  create_dir("watch_dir");
  create_file("watch_dir/file1");

  r = uv_fs_event_init(loop, &fs_event);
  ASSERT_OK(r);
  r = uv_fs_event_start(&fs_event,
                        fs_event_cb_file,
                        "watch_dir/file1",
                        0);
  ASSERT_OK(r);

  uv_close((uv_handle_t*)&fs_event, close_cb);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT_OK(fs_event_cb_called);
  ASSERT_EQ(1, close_cb_called);

  /* Cleanup */
  remove("watch_dir/file1");
  remove("watch_dir/");

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}